

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlRelaxNGGetParserErrors(void)

{
  int iVar1;
  int iVar2;
  void **val;
  uint local_54;
  int n_ctx;
  void **ctx;
  int n_warn;
  xmlRelaxNGValidityWarningFunc *warn;
  int n_err;
  xmlRelaxNGValidityErrorFunc *err;
  int n_ctxt;
  xmlRelaxNGParserCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (err._4_4_ = 0; (int)err._4_4_ < 1; err._4_4_ = err._4_4_ + 1) {
    for (warn._4_4_ = 0; (int)warn._4_4_ < 1; warn._4_4_ = warn._4_4_ + 1) {
      for (ctx._4_4_ = 0; (int)ctx._4_4_ < 1; ctx._4_4_ = ctx._4_4_ + 1) {
        for (local_54 = 0; (int)local_54 < 1; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_void_ptr_ptr(local_54,3);
          iVar2 = xmlRelaxNGGetParserErrors(0,0,0,val);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_void_ptr_ptr(local_54,val,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlRelaxNGGetParserErrors",
                   (ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)err._4_4_);
            printf(" %d",(ulong)warn._4_4_);
            printf(" %d",(ulong)ctx._4_4_);
            printf(" %d",(ulong)local_54);
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlRelaxNGGetParserErrors(void) {
    int test_ret = 0;

#if defined(LIBXML_RELAXNG_ENABLED)
    int mem_base;
    int ret_val;
    xmlRelaxNGParserCtxtPtr ctxt; /* a Relax-NG validation context */
    int n_ctxt;
    xmlRelaxNGValidityErrorFunc * err; /* the error callback result */
    int n_err;
    xmlRelaxNGValidityWarningFunc * warn; /* the warning callback result */
    int n_warn;
    void ** ctx; /* contextual data for the callbacks result */
    int n_ctx;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlRelaxNGParserCtxtPtr;n_ctxt++) {
    for (n_err = 0;n_err < gen_nb_xmlRelaxNGValidityErrorFunc_ptr;n_err++) {
    for (n_warn = 0;n_warn < gen_nb_xmlRelaxNGValidityWarningFunc_ptr;n_warn++) {
    for (n_ctx = 0;n_ctx < gen_nb_void_ptr_ptr;n_ctx++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlRelaxNGParserCtxtPtr(n_ctxt, 0);
        err = gen_xmlRelaxNGValidityErrorFunc_ptr(n_err, 1);
        warn = gen_xmlRelaxNGValidityWarningFunc_ptr(n_warn, 2);
        ctx = gen_void_ptr_ptr(n_ctx, 3);

        ret_val = xmlRelaxNGGetParserErrors(ctxt, err, warn, ctx);
        desret_int(ret_val);
        call_tests++;
        des_xmlRelaxNGParserCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlRelaxNGValidityErrorFunc_ptr(n_err, err, 1);
        des_xmlRelaxNGValidityWarningFunc_ptr(n_warn, warn, 2);
        des_void_ptr_ptr(n_ctx, ctx, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlRelaxNGGetParserErrors",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_err);
            printf(" %d", n_warn);
            printf(" %d", n_ctx);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}